

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

Value * __thiscall
ot::commissioner::Interpreter::ProcessCommDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  string *this_00;
  string *this_01;
  ErrorCode EVar1;
  pointer pbVar2;
  element_type *peVar3;
  undefined1 auVar4 [8];
  string *this_02;
  int iVar5;
  char *pcVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  CommissionerDataset *extraout_RDX;
  CommissionerDataset *extraout_RDX_00;
  CommissionerDataset *extraout_RDX_01;
  CommissionerDataset *extraout_RDX_02;
  CommissionerDataset *aDataset;
  pointer puVar8;
  char *pcVar9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar10;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  CommissionerDataset dataset;
  format_string_checker<char> local_248;
  undefined1 local_218 [8];
  _Alloc_hider _Stack_210;
  undefined1 local_208 [24];
  _Alloc_hider local_1f0;
  size_type local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  undefined1 local_1c8 [8];
  pointer local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1b8;
  pointer puStack_1a8;
  pointer *local_1a0;
  pointer puStack_198;
  pointer local_190;
  pointer puStack_188;
  pointer local_180;
  undefined8 uStack_178;
  string *local_170;
  CommissionerAppPtr *local_168;
  undefined4 local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  ErrorCode local_138;
  undefined1 *local_130;
  long local_128;
  undefined1 local_120 [16];
  ErrorCode local_110;
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  string local_e8;
  undefined4 local_c8 [2];
  long local_c0;
  long local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Error local_a0;
  undefined4 local_78 [2];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  this_01 = &__return_storage_ptr__->mData;
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_218 = (undefined1  [8])((ulong)local_218 & 0xffffffff00000000);
    _Stack_210._M_p = "too few arguments";
    local_208._0_8_ = 0x11;
    local_208._8_8_ = 0;
    local_1f0._M_p = (pointer)0x0;
    pcVar9 = "too few arguments";
    local_208._16_8_ = (format_string_checker<char> *)local_218;
    do {
      pcVar6 = pcVar9 + 1;
      if (*pcVar9 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar9 + 2;
      }
      else if (*pcVar9 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar9,"",(format_string_checker<char> *)local_218);
      }
      pcVar9 = pcVar6;
    } while (pcVar6 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_218;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&local_248,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_138 = kInvalidArgs;
    local_130 = local_120;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,local_248._0_8_,
               local_248.context_.super_basic_format_parse_context<char>.format_str_.data_ +
               local_248._0_8_);
    local_1c8._0_4_ = local_138;
    local_1c0 = (pointer)(aStack_1b8._M_local_buf + 8);
    std::__cxx11::string::_M_construct<char*>((string *)&local_1c0,local_130,local_130 + local_128);
    puStack_198 = (pointer)0x0;
    local_190 = (pointer)((ulong)local_190 & 0xffffffffffffff00);
    (__return_storage_ptr__->mError).mCode = local_1c8._0_4_;
    local_1a0 = &local_190;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_1c0);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_1a0);
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0);
    }
    if (local_1c0 != (pointer)(aStack_1b8._M_local_buf + 8)) {
      operator_delete(local_1c0);
    }
    if (local_130 != local_120) {
      operator_delete(local_130);
    }
LAB_001c0884:
    puVar8 = (pointer)local_248._0_8_;
    if ((size_t *)local_248._0_8_ ==
        &local_248.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      return __return_storage_ptr__;
    }
    goto LAB_001c0889;
  }
  local_248._0_8_ = &local_248.context_.super_basic_format_parse_context<char>.format_str_.size_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"get","");
  utils::ToLower((string *)local_1c8,pbVar2 + 1);
  utils::ToLower((string *)local_218,(string *)&local_248);
  auVar4 = local_218;
  if (local_1c0 == (pointer)_Stack_210._M_p) {
    if (local_1c0 == (pointer)0x0) {
      bVar10 = true;
    }
    else {
      iVar5 = bcmp((void *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),(void *)local_218,
                   (size_t)local_1c0);
      bVar10 = iVar5 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  local_168 = aCommissioner;
  if (auVar4 != (undefined1  [8])local_208) {
    operator_delete((void *)auVar4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != &aStack_1b8) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
  }
  if ((size_t *)local_248._0_8_ !=
      &local_248.context_.super_basic_format_parse_context<char>.format_str_.size_) {
    operator_delete((void *)local_248._0_8_);
  }
  if (bVar10) {
    local_1c8._0_4_ = kNone;
    local_1c0 = (pointer)0x0;
    aStack_1b8._M_allocated_capacity = 0;
    aStack_1b8._8_8_ = 0;
    puStack_1a8 = (pointer)0x0;
    local_1a0 = (pointer *)0x0;
    puStack_198 = (pointer)0x0;
    local_190 = (pointer)0x0;
    puStack_188 = (pointer)0x0;
    local_180 = (pointer)0x0;
    uStack_178._0_2_ = 0;
    uStack_178._2_2_ = 0;
    uStack_178._4_2_ = 0;
    uStack_178._6_2_ = 0;
    peVar3 = (local_168->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1b])
              (local_78,peVar3,local_1c8,0xffff);
    local_218._0_4_ = local_78[0];
    pcVar9 = local_208 + 8;
    _Stack_210._M_p = pcVar9;
    std::__cxx11::string::_M_construct<char*>((string *)&_Stack_210,local_70,local_70 + local_68);
    local_1e8 = 0;
    local_1e0._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_218._0_4_;
    local_1f0._M_p = (pointer)&local_1e0;
    std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_210);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_1f0);
    EVar1 = (__return_storage_ptr__->mError).mCode;
    aDataset = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_p != &local_1e0) {
      operator_delete(local_1f0._M_p);
      aDataset = extraout_RDX_00;
    }
    if (_Stack_210._M_p != pcVar9) {
      operator_delete(_Stack_210._M_p);
      aDataset = extraout_RDX_01;
    }
    if (local_70 != local_60) {
      operator_delete(local_70);
      aDataset = extraout_RDX_02;
    }
    if (EVar1 == kNone) {
      CommissionerDatasetToJson_abi_cxx11_(&local_50,(commissioner *)local_1c8,aDataset);
      Value::Value((Value *)local_218,&local_50);
      (__return_storage_ptr__->mError).mCode = local_218._0_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_210);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p);
      }
      if (_Stack_210._M_p != pcVar9) {
        operator_delete(_Stack_210._M_p);
      }
      paVar7 = &local_50.field_2;
      goto LAB_001c1026;
    }
  }
  else {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_248._0_8_ = &local_248.context_.super_basic_format_parse_context<char>.format_str_.size_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"set","");
    utils::ToLower((string *)local_1c8,pbVar2 + 1);
    utils::ToLower((string *)local_218,(string *)&local_248);
    auVar4 = local_218;
    local_170 = (string *)this_01;
    if (local_1c0 == (pointer)_Stack_210._M_p) {
      if (local_1c0 == (pointer)0x0) {
        bVar10 = true;
      }
      else {
        iVar5 = bcmp((void *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_),(void *)local_218,
                     (size_t)local_1c0);
        bVar10 = iVar5 == 0;
      }
    }
    else {
      bVar10 = false;
    }
    if (auVar4 != (undefined1  [8])local_208) {
      operator_delete((void *)auVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_) != &aStack_1b8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1c8._4_4_,local_1c8._0_4_));
    }
    if ((size_t *)local_248._0_8_ !=
        &local_248.context_.super_basic_format_parse_context<char>.format_str_.size_) {
      operator_delete((void *)local_248._0_8_);
    }
    this_02 = local_170;
    if (!bVar10) {
      local_218._0_4_ = 0xd;
      _Stack_210._M_p = "\'{}\' is not a valid sub-command";
      local_208._0_8_ = 0x1f;
      local_208._8_8_ = 0x100000000;
      local_1f0._M_p =
           (pointer)::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar9 = "\'{}\' is not a valid sub-command";
      local_208._16_8_ = (format_string_checker<char> *)local_218;
      do {
        pcVar6 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar9,"",(format_string_checker<char> *)local_218);
        }
        pcVar9 = pcVar6;
      } while (pcVar6 != "");
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_218 = (undefined1  [8])pbVar2[1]._M_dataplus._M_p;
      _Stack_210._M_p = (pointer)pbVar2[1]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_218;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&local_248,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
      local_110 = kInvalidCommand;
      local_108 = local_f8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,local_248._0_8_,
                 local_248.context_.super_basic_format_parse_context<char>.format_str_.data_ +
                 local_248._0_8_);
      local_1c8._0_4_ = local_110;
      local_1c0 = (pointer)(aStack_1b8._M_local_buf + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c0,local_108,local_108 + local_100);
      puStack_198 = (pointer)0x0;
      local_190 = (pointer)((ulong)local_190 & 0xffffffffffffff00);
      (__return_storage_ptr__->mError).mCode = local_1c8._0_4_;
      local_1a0 = &local_190;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_1c0);
      std::__cxx11::string::operator=(local_170,(string *)&local_1a0);
      if (local_1a0 != &local_190) {
        operator_delete(local_1a0);
      }
      if (local_1c0 != (pointer)(aStack_1b8._M_local_buf + 8)) {
        operator_delete(local_1c0);
      }
      if (local_108 != local_f8) {
        operator_delete(local_108);
      }
      goto LAB_001c0884;
    }
    local_1c8._0_4_ = kNone;
    local_1c0 = (pointer)0x0;
    aStack_1b8._M_allocated_capacity = 0;
    aStack_1b8._8_8_ = 0;
    puStack_1a8 = (pointer)0x0;
    local_1a0 = (pointer *)0x0;
    puStack_198 = (pointer)0x0;
    local_190 = (pointer)0x0;
    puStack_188 = (pointer)0x0;
    local_180 = (pointer)0x0;
    uStack_178._0_2_ = 0;
    uStack_178._2_2_ = 0;
    uStack_178._4_2_ = 0;
    uStack_178._6_2_ = 0;
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
      local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
      local_248.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too few arguments";
      local_248.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
      local_248.context_.super_basic_format_parse_context<char>._16_8_ = 0;
      local_248.parse_funcs_[0] = (parse_func)0x0;
      pcVar9 = "too few arguments";
      local_248.context_.types_ = local_248.types_;
      do {
        pcVar6 = pcVar9 + 1;
        if (*pcVar9 == '}') {
          if ((pcVar6 == "") || (*pcVar6 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar6 = pcVar9 + 2;
        }
        else if (*pcVar9 == '{') {
          pcVar6 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar9,"",&local_248);
        }
        pcVar9 = pcVar6;
      } while (pcVar6 != "");
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_248;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e8,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
      local_160 = 2;
      local_158 = local_148;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_e8._M_dataplus._M_p,
                 local_e8._M_dataplus._M_p + local_e8._M_string_length);
      local_218._0_4_ = local_160;
      _Stack_210._M_p = local_208 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_210,local_158,local_158 + local_150);
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_218._0_4_;
      local_1f0._M_p = (pointer)&local_1e0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_210);
      std::__cxx11::string::operator=(this_02,(string *)&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p);
      }
      if (_Stack_210._M_p != local_208 + 8) {
        operator_delete(_Stack_210._M_p);
      }
      if (local_158 != local_148) {
        operator_delete(local_158);
      }
      paVar7 = &local_e8.field_2;
    }
    else {
      CommissionerDatasetFromJson(&local_a0,(CommissionerDataset *)local_1c8,pbVar2 + 2);
      local_218._0_4_ = local_a0.mCode;
      _Stack_210._M_p = local_208 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_210,local_a0.mMessage._M_dataplus._M_p,
                 local_a0.mMessage._M_dataplus._M_p + local_a0.mMessage._M_string_length);
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_218._0_4_;
      local_1f0._M_p = (pointer)&local_1e0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_210);
      std::__cxx11::string::operator=(this_02,(string *)&local_1f0);
      EVar1 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p);
      }
      if (_Stack_210._M_p != local_208 + 8) {
        operator_delete(_Stack_210._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0.mMessage._M_dataplus._M_p != &local_a0.mMessage.field_2) {
        operator_delete(local_a0.mMessage._M_dataplus._M_p);
      }
      if (EVar1 != kNone) goto LAB_001c1034;
      peVar3 = (local_168->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1c])
                (local_c8,peVar3,local_1c8);
      local_218._0_4_ = local_c8[0];
      _Stack_210._M_p = local_208 + 8;
      std::__cxx11::string::_M_construct<char*>((string *)&_Stack_210,local_c0,local_b8 + local_c0);
      local_1e8 = 0;
      local_1e0._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_218._0_4_;
      local_1f0._M_p = (pointer)&local_1e0;
      std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_210);
      std::__cxx11::string::operator=(this_02,(string *)&local_1f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_p != &local_1e0) {
        operator_delete(local_1f0._M_p);
      }
      if (_Stack_210._M_p != local_208 + 8) {
        operator_delete(_Stack_210._M_p);
      }
      paVar7 = &local_b0;
    }
LAB_001c1026:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar7->_M_local_buf + -0x10) != paVar7) {
      operator_delete(*(undefined1 **)(paVar7->_M_local_buf + -0x10));
    }
  }
LAB_001c1034:
  if (local_190 != (pointer)0x0) {
    operator_delete(local_190);
  }
  if (puStack_1a8 != (pointer)0x0) {
    operator_delete(puStack_1a8);
  }
  puVar8 = local_1c0;
  if (local_1c0 == (pointer)0x0) {
    return __return_storage_ptr__;
  }
LAB_001c0889:
  operator_delete(puVar8);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessCommDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        CommissionerDataset dataset;
        SuccessOrExit(value = aCommissioner->GetCommissionerDataset(dataset, 0xFFFF));
        value = CommissionerDatasetToJson(dataset);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        CommissionerDataset dataset;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = CommissionerDatasetFromJson(dataset, aExpr[2]));
        SuccessOrExit(value = aCommissioner->SetCommissionerDataset(dataset));
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}